

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O2

BBox<3> * Omega_h::find_bounding_box<3>(BBox<3> *__return_storage_ptr__,Reals *coords)

{
  Alloc *pAVar1;
  Int i;
  int iVar2;
  long lVar3;
  size_t sVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  Write<double> local_a8;
  Write<double> local_98;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  BBox<3> init;
  
  pAVar1 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  iVar2 = divide_no_remainder<int>((int)(sVar4 >> 3),3);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    init.min.super_Few<double,_3>.array_[lVar3] = 1.79769313486232e+308;
    init.max.super_Few<double,_3>.array_[lVar3] = -1.79769313486232e+308;
  }
  local_68 = init.max.super_Few<double,_3>.array_[1];
  dStack_60 = init.max.super_Few<double,_3>.array_[2];
  local_78 = init.min.super_Few<double,_3>.array_[2];
  dStack_70 = init.max.super_Few<double,_3>.array_[0];
  local_88 = init.min.super_Few<double,_3>.array_[0];
  dStack_80 = init.min.super_Few<double,_3>.array_[1];
  Write<double>::Write(&local_98,&coords->write_);
  Write<double>::Write(&local_a8,&local_98);
  transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<3>,Omega_h::BBox<3>,Omega_h::UniteOp<3>>
            (__return_storage_ptr__,(Omega_h *)0x0,iVar2,&local_a8,in_R8,in_R9,local_88._0_4_,
             dStack_80._0_4_,local_78._0_4_,dStack_70._0_4_,local_68._0_4_,dStack_60._0_4_);
  Write<double>::~Write(&local_a8);
  Write<double>::~Write(&local_98);
  return __return_storage_ptr__;
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}